

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

bblist * listbigfile_r(char *basename,char *blockname,bblist *bblist)

{
  uint uVar1;
  char *pcVar2;
  char *basename_00;
  FILE *__stream;
  size_t sVar3;
  bblist *pbVar4;
  ulong uVar5;
  dirent **namelist;
  char *local_40;
  ulong local_38;
  
  local_40 = blockname;
  pcVar2 = _path_join(basename,blockname);
  uVar1 = scandir(pcVar2,(dirent ***)&namelist,filter,_alphasort);
  free(pcVar2);
  if (-1 < (int)uVar1) {
    local_38 = (ulong)uVar1;
    for (uVar5 = 0; local_38 != uVar5; uVar5 = uVar5 + 1) {
      pcVar2 = _path_join(local_40,namelist[uVar5]->d_name);
      basename_00 = _path_join(basename,pcVar2);
      __stream = (FILE *)_big_file_open_a_file(basename_00,-1,"r",0);
      if (__stream == (FILE *)0x0) {
        pbVar4 = listbigfile_r(basename,pcVar2,bblist);
      }
      else {
        fclose(__stream);
        sVar3 = strlen(pcVar2);
        pbVar4 = (bblist *)malloc(sVar3 + 0x11);
        pbVar4->next = bblist;
        pbVar4->blockname = (char *)(pbVar4 + 1);
        strcpy((char *)(pbVar4 + 1),pcVar2);
      }
      free(basename_00);
      free(pcVar2);
      free(namelist[uVar5]);
      bblist = pbVar4;
    }
    free(namelist);
  }
  return bblist;
}

Assistant:

static struct
bblist * listbigfile_r(const char * basename, char * blockname, struct bblist * bblist) {
    struct dirent **namelist;
    int n;
    int i;

    char * current;
    current = _path_join(basename, blockname);

    n = scandir(current, &namelist, filter, _alphasort);
    free(current);
    if (n < 0)
        return bblist;

    for(i = 0; i < n ; i ++) {
        char * blockname1 = _path_join(blockname, namelist[i]->d_name);
        char * fullpath1 = _path_join(basename, blockname1);
        if(_big_file_path_is_block(fullpath1)) {
            struct bblist * n = malloc(sizeof(struct bblist) + strlen(blockname1) + 1);
            n->next = bblist;
            n->blockname = (char*) &n[1];
            strcpy(n->blockname, blockname1);
            bblist = n;
        } else {
            bblist = listbigfile_r(basename, blockname1, bblist);
        }
        free(fullpath1);
        free(blockname1);
        free(namelist[i]);
    }
    free(namelist);
    return bblist;
}